

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void RPCTypeCheckObj(UniValue *o,
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
                    *typesExpected,bool fAllowNull,bool fStrict)

{
  _Rb_tree_header *p_Var1;
  VType VVar2;
  pointer pbVar3;
  UniValue *pUVar4;
  _Base_ptr p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  const_iterator cVar7;
  UniValue *__return_storage_ptr__;
  undefined7 in_register_00000009;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char **in_R9;
  pointer __k;
  long in_FS_OFFSET;
  bool bVar8;
  string_view key;
  string err;
  undefined1 local_68 [48];
  long local_38;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT71(in_register_00000009,fStrict);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(typesExpected->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var5 = (typesExpected->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    key._M_str = *(char **)(p_Var5 + 1);
    key._M_len = (size_t)p_Var5[1]._M_parent;
    pUVar4 = UniValue::find_value(o,key);
    VVar2 = pUVar4->typ;
    if ((!fAllowNull) && (VVar2 == VNULL)) {
      pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
      tinyformat::format<std::__cxx11::string>
                ((string *)(local_68 + 0x10),(tinyformat *)"Missing %s",(char *)(p_Var5 + 1),args);
      JSONRPCError(pUVar4,-3,(string *)(local_68 + 0x10));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00d8ebd8;
    }
    if (((char)p_Var5[2]._M_color == _S_red) &&
       (bVar8 = VVar2 == *(VType *)&p_Var5[2].field_0x4,
       args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT71((int7)((ulong)args >> 8),bVar8), (VVar2 != VNULL || !fAllowNull) && !bVar8))
    {
      __return_storage_ptr__ = (UniValue *)__cxa_allocate_exception(0x58);
      local_68._8_8_ = uvTypeName(pUVar4->typ);
      local_68._0_8_ = uvTypeName(*(VType *)&p_Var5[2].field_0x4);
      tinyformat::format<char_const*,std::__cxx11::string,char_const*>
                ((string *)(local_68 + 0x10),
                 (tinyformat *)"JSON value of type %s for field %s is not of expected type %s",
                 local_68 + 8,(char **)(p_Var5 + 1),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,in_R9
                );
      JSONRPCError(__return_storage_ptr__,-3,(string *)(local_68 + 0x10));
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(__return_storage_ptr__,&UniValue::typeinfo,UniValue::~UniValue);
      }
      goto LAB_00d8ebd8;
    }
  }
  if (fStrict) {
    pvVar6 = UniValue::getKeys_abi_cxx11_(o);
    pbVar3 = (pvVar6->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__k = (pvVar6->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __k != pbVar3; __k = __k + 1) {
      cVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValueType>_>_>
              ::find(&typesExpected->_M_t,__k);
      if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
        tinyformat::format<std::__cxx11::string>
                  ((string *)(local_68 + 0x10),(tinyformat *)"Unexpected key %s",(char *)__k,args);
        pUVar4 = (UniValue *)__cxa_allocate_exception(0x58);
        JSONRPCError(pUVar4,-3,(string *)(local_68 + 0x10));
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pUVar4,&UniValue::typeinfo,UniValue::~UniValue);
        }
        goto LAB_00d8ebd8;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00d8ebd8:
  __stack_chk_fail();
}

Assistant:

void RPCTypeCheckObj(const UniValue& o,
    const std::map<std::string, UniValueType>& typesExpected,
    bool fAllowNull,
    bool fStrict)
{
    for (const auto& t : typesExpected) {
        const UniValue& v = o.find_value(t.first);
        if (!fAllowNull && v.isNull())
            throw JSONRPCError(RPC_TYPE_ERROR, strprintf("Missing %s", t.first));

        if (!(t.second.typeAny || v.type() == t.second.type || (fAllowNull && v.isNull())))
            throw JSONRPCError(RPC_TYPE_ERROR, strprintf("JSON value of type %s for field %s is not of expected type %s", uvTypeName(v.type()),  t.first, uvTypeName(t.second.type)));
    }

    if (fStrict)
    {
        for (const std::string& k : o.getKeys())
        {
            if (typesExpected.count(k) == 0)
            {
                std::string err = strprintf("Unexpected key %s", k);
                throw JSONRPCError(RPC_TYPE_ERROR, err);
            }
        }
    }
}